

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

int Jf_CutDeref_rec(Jf_Man_t *p,int *pCut)

{
  int *piVar1;
  uint uVar2;
  word *pwVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = (uint)*pCut >> 4 & 0xf;
  if ((*pCut & 0xfU) != 0) {
    uVar8 = 0;
    do {
      uVar4 = pCut[uVar8 + 1];
      if ((int)uVar4 < 0) {
LAB_00706246:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (uVar4 < 2) {
        return uVar7;
      }
      uVar4 = uVar4 >> 1;
      piVar1 = p->pGia->pRefs + uVar4;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        if ((p->vCuts).nSize <= (int)uVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = (p->vCuts).pArray[uVar4];
        pwVar3 = (p->pMem).pPages[(int)uVar2 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar6 = (long)(int)(uVar2 & (p->pMem).uPageMask);
        if ((*(uint *)((long)pwVar3 + lVar6 * 8 + 4) & 0xf) == 1) {
          if ((int)(uint)pwVar3[lVar6 + 1] < 0) goto LAB_00706246;
          if ((uint)pwVar3[lVar6 + 1] >> 1 == uVar4) goto LAB_00706226;
        }
        iVar5 = Jf_CutDeref_rec(p,(int *)((long)pwVar3 + lVar6 * 8 + 4));
        uVar7 = uVar7 + iVar5;
      }
LAB_00706226:
      uVar8 = uVar8 + 1;
    } while (uVar8 < (*pCut & 0xf));
  }
  return uVar7;
}

Assistant:

int Jf_CutDeref_rec( Jf_Man_t * p, int * pCut )
{
    int i, Var, Count = Jf_CutCost(pCut);
    Jf_CutForEachVar( pCut, Var, i )
        if ( !Gia_ObjRefDecId(p->pGia, Var) && !Jf_CutIsTriv(Jf_ObjCutBest(p, Var), Var) )
            Count += Jf_CutDeref_rec( p, Jf_ObjCutBest(p, Var) );
    return Count;
}